

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

U64 Perft(int depth,game *Game)

{
  bool bVar1;
  move moveMade;
  U64 UVar2;
  long lVar3;
  game *pgVar4;
  game *pgVar5;
  U64 UVar6;
  byte bVar7;
  arrayMoveList moves;
  game local_448;
  arrayMoveList local_338;
  
  bVar7 = 0;
  if (depth == 0) {
    UVar6 = 1;
  }
  else {
    game::generateLegalMoves(&local_338,Game);
    arrayMoveList::resetIterator(&local_338);
    bVar1 = arrayMoveList::next(&local_338);
    if (bVar1) {
      UVar6 = 0;
      do {
        moveMade = arrayMoveList::getMove(&local_338);
        game::makeMove(Game,moveMade);
        pgVar4 = Game;
        pgVar5 = &local_448;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pgVar5->boards).WP = (pgVar4->boards).WP;
          pgVar4 = (game *)((long)pgVar4 + (ulong)bVar7 * -0x10 + 8);
          pgVar5 = (game *)((long)pgVar5 + (ulong)bVar7 * -0x10 + 8);
        }
        std::deque<bitboards,_std::allocator<bitboards>_>::deque
                  (&local_448.boardHistory.c,&(Game->boardHistory).c);
        std::deque<move,_std::allocator<move>_>::deque(&local_448.history.c,&(Game->history).c);
        local_448.blacksTurn = Game->blacksTurn;
        UVar2 = Perft(depth + -1,&local_448);
        UVar6 = UVar6 + UVar2;
        std::_Deque_base<move,_std::allocator<move>_>::~_Deque_base
                  ((_Deque_base<move,_std::allocator<move>_> *)&local_448.history);
        std::_Deque_base<bitboards,_std::allocator<bitboards>_>::~_Deque_base
                  ((_Deque_base<bitboards,_std::allocator<bitboards>_> *)&local_448.boardHistory);
        game::undoMove(Game);
        bVar1 = arrayMoveList::next(&local_338);
      } while (bVar1);
    }
    else {
      UVar6 = 0;
    }
  }
  return UVar6;
}

Assistant:

U64 Perft(int depth, game Game)
{
    U64 nodes = 0;

    if (depth == 0) return 1;

    arrayMoveList moves = Game.generateLegalMoves();

    moves.resetIterator();
    while(moves.next()) {
      Game.makeMove(moves.getMove());
      nodes += Perft(depth - 1, Game);
      Game.undoMove();
    }
    return nodes;
}